

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xpathInternals(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  xmlNodePtr pxVar11;
  FILE *pFVar12;
  xmlChar *pxVar13;
  xmlNsPtr pxVar14;
  long lVar15;
  xmlXPathObjectPtr pxVar16;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int nr_12;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int nr_17;
  int nr_18;
  int nr_19;
  int nr_20;
  int nr_21;
  int test_ret;
  int test_ret_5;
  ulong uVar17;
  xmlNodePtr in_RSI;
  xmlNodePtr pxVar18;
  bool bVar19;
  int test_ret_2;
  ulong uVar20;
  int test_ret_3;
  uint no;
  undefined8 *puVar21;
  int test_ret_8;
  int n_output;
  int local_8c;
  int test_ret_29;
  int local_84;
  int local_80;
  int test_ret_1;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  
  if (quiet == '\0') {
    puts("Testing xpathInternals : 106 of 117 functions ...");
  }
  bVar19 = true;
  iVar3 = 0;
  while (bVar19) {
    iVar1 = xmlMemBlocks();
    uVar10 = valuePop(0);
    xmlXPathFreeObject(uVar10);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in valuePop");
    iVar3 = iVar3 + 1;
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar1 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar5 = (int)pxVar18;
      if (iVar5 == 5) break;
      iVar4 = xmlMemBlocks();
      pxVar11 = (xmlNodePtr)gen_xmlXPathObjectPtr(iVar5,iVar2);
      in_RSI = pxVar11;
      valuePush();
      call_tests = call_tests + 1;
      if (pxVar11 != (xmlNodePtr)0x0) {
        xmlXPathFreeObject();
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in valuePush",(ulong)(uint)(iVar2 - iVar4));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar5 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  iVar3 = iVar3 + iVar1;
  bVar19 = true;
  while (bVar19) {
    iVar1 = xmlMemBlocks();
    xmlXPathAddValues(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathAddValues");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + 1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_80 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathBooleanFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathBooleanFunction",(ulong)(uint)(iVar1 - iVar5));
        local_80 = local_80 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_78 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathCeilingFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathCeilingFunction",(ulong)(uint)(iVar1 - iVar5));
        local_78 = local_78 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  pxVar18 = (xmlNodePtr)0x1;
  local_84 = 0;
  while (pxVar18 != (xmlNodePtr)0x0) {
    uVar17 = 0;
    while( true ) {
      pxVar18 = (xmlNodePtr)0x0;
      iVar1 = (int)uVar17;
      if (iVar1 == 4) break;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar5 = (int)pxVar18;
        if (iVar5 == 4) break;
        iVar4 = xmlMemBlocks();
        uVar6 = gen_int(iVar1,iVar2);
        iVar2 = gen_int(iVar5,iVar2);
        in_RSI = (xmlNodePtr)(ulong)uVar6;
        xmlXPathCompareValues(0,in_RSI,iVar2);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar4 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathCompareValues",(ulong)(uint)(iVar2 - iVar4));
          local_84 = local_84 + 1;
          printf(" %d",0);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar18;
        }
        pxVar18 = (xmlNodePtr)(ulong)(iVar5 + 1);
      }
      uVar17 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_6c = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathConcatFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathConcatFunction",(ulong)(uint)(iVar1 - iVar5));
        local_6c = local_6c + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_70 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathContainsFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathContainsFunction",(ulong)(uint)(iVar1 - iVar5));
        local_70 = local_70 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_74 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathCountFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathCountFunction",(ulong)(uint)(iVar1 - iVar5));
        local_74 = local_74 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (uVar6 = 0; uVar6 != 2; uVar6 = uVar6 + 1) {
    bVar19 = true;
    while (bVar19) {
      pxVar18 = (xmlNodePtr)0x0;
      while( true ) {
        iVar1 = (int)in_RSI;
        iVar2 = (int)pxVar18;
        if (iVar2 == 4) break;
        iVar5 = xmlMemBlocks();
        pFVar12 = (FILE *)gen_FILE_ptr(uVar6,iVar1);
        iVar1 = gen_int(iVar2,iVar1);
        in_RSI = (xmlNodePtr)0x0;
        xmlXPathDebugDumpCompExpr(pFVar12,0,iVar1);
        call_tests = call_tests + 1;
        if (pFVar12 != (FILE *)0x0) {
          fclose(pFVar12);
        }
        xmlResetLastError();
        iVar1 = xmlMemBlocks();
        if (iVar5 != iVar1) {
          iVar1 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathDebugDumpCompExpr",(ulong)(uint)(iVar1 - iVar5)
                );
          test_ret_1 = test_ret_1 + 1;
          printf(" %d",(ulong)uVar6);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar18;
        }
        pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
      }
      bVar19 = false;
    }
  }
  function_tests = function_tests + 1;
  test_ret_29 = 0;
  uVar17 = 0;
  while (iVar1 = (int)uVar17, iVar1 != 2) {
    uVar20 = 0;
    while (iVar2 = (int)uVar20, iVar2 != 5) {
      pxVar18 = (xmlNodePtr)0x0;
      while( true ) {
        iVar5 = (int)in_RSI;
        iVar4 = (int)pxVar18;
        if (iVar4 == 4) break;
        iVar7 = xmlMemBlocks();
        pFVar12 = (FILE *)gen_FILE_ptr(iVar1,iVar5);
        pxVar11 = (xmlNodePtr)gen_xmlXPathObjectPtr(iVar2,iVar5);
        iVar5 = gen_int(iVar4,iVar5);
        in_RSI = pxVar11;
        xmlXPathDebugDumpObject(pFVar12,pxVar11,iVar5);
        call_tests = call_tests + 1;
        if (pFVar12 != (FILE *)0x0) {
          fclose(pFVar12);
        }
        if (pxVar11 != (xmlNodePtr)0x0) {
          xmlXPathFreeObject();
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar7 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathDebugDumpObject",(ulong)(uint)(iVar5 - iVar7));
          test_ret_29 = test_ret_29 + 1;
          printf(" %d",uVar17);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar18;
        }
        pxVar18 = (xmlNodePtr)(ulong)(iVar4 + 1);
      }
      uVar20 = (ulong)(iVar2 + 1);
    }
    uVar17 = (ulong)(iVar1 + 1);
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  bVar19 = true;
LAB_0014606b:
  if (bVar19) {
    bVar19 = true;
    while (bVar19) {
      iVar2 = xmlMemBlocks();
      bVar19 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlXPathDifference(0);
      xmlXPathFreeNodeSet();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar2 == iVar5) goto LAB_0014606b;
      xmlMemBlocks();
      bVar19 = false;
      printf("Leak of %d blocks found in xmlXPathDifference");
      iVar1 = iVar1 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar19 = false;
    goto LAB_0014606b;
  }
  function_tests = function_tests + 1;
  test_ret_29 = test_ret_29 + iVar1 + iVar3 +
                local_70 + local_74 + test_ret_1 + local_84 + local_6c + local_80 + local_78;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    uVar10 = xmlXPathDistinct(0);
    xmlXPathFreeNodeSet(uVar10);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathDistinct");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    test_ret_29 = test_ret_29 + 1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    uVar10 = xmlXPathDistinctSorted(0);
    xmlXPathFreeNodeSet(uVar10);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathDistinctSorted");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    test_ret_29 = test_ret_29 + 1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathDivValues(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathDivValues");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    test_ret_29 = test_ret_29 + 1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathEqualValues(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathEqualValues");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    test_ret_29 = test_ret_29 + 1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar3 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathErr();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathErr",(ulong)(uint)(iVar1 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  test_ret_29 = test_ret_29 + iVar3;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathEvalExpr(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathEvalExpr");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    test_ret_29 = test_ret_29 + 1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_84 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar1 = (int)pxVar18;
      if (iVar1 == 5) break;
      iVar2 = xmlMemBlocks();
      pxVar11 = (xmlNodePtr)gen_xmlXPathObjectPtr(iVar1,iVar3);
      in_RSI = pxVar11;
      xmlXPathEvaluatePredicateResult();
      call_tests = call_tests + 1;
      if (pxVar11 != (xmlNodePtr)0x0) {
        xmlXPathFreeObject();
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathEvaluatePredicateResult",
               (ulong)(uint)(iVar3 - iVar2));
        local_84 = local_84 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar1 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar3 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathFalseFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathFalseFunction",(ulong)(uint)(iVar1 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  test_ret_1 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathFloorFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathFloorFunction",(ulong)(uint)(iVar1 - iVar5));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  local_70 = 0;
  bVar19 = true;
LAB_0014661a:
  if (bVar19) {
    bVar19 = true;
    while (bVar19) {
      iVar1 = xmlMemBlocks();
      bVar19 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlXPathHasSameNodes();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 == iVar2) goto LAB_0014661a;
      xmlMemBlocks();
      bVar19 = false;
      printf("Leak of %d blocks found in xmlXPathHasSameNodes");
      local_70 = local_70 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar19 = false;
    goto LAB_0014661a;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_80 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathIdFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathIdFunction",(ulong)(uint)(iVar1 - iVar5));
        local_80 = local_80 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  local_74 = 0;
  bVar19 = true;
LAB_00146752:
  if (bVar19) {
    bVar19 = true;
    while (bVar19) {
      iVar1 = xmlMemBlocks();
      bVar19 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlXPathIntersection(0);
      xmlXPathFreeNodeSet();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 == iVar2) goto LAB_00146752;
      xmlMemBlocks();
      bVar19 = false;
      printf("Leak of %d blocks found in xmlXPathIntersection");
      local_74 = local_74 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar19 = false;
    goto LAB_00146752;
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  pxVar18 = (xmlNodePtr)0x0;
  while (iVar2 = (int)pxVar18, iVar2 != 5) {
    iVar5 = xmlMemBlocks();
    gen_const_xmlChar_ptr(iVar2,(int)in_RSI);
    xmlXPathIsNodeType();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar5 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathIsNodeType",(ulong)(uint)(iVar4 - iVar5));
      iVar1 = iVar1 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar18;
    }
    pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_78 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar5 = (int)pxVar18;
      if (iVar5 == 4) break;
      iVar4 = xmlMemBlocks();
      uVar6 = gen_int(iVar5,iVar2);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathLangFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathLangFunction",(ulong)(uint)(iVar2 - iVar4));
        local_78 = local_78 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar5 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_6c = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar5 = (int)pxVar18;
      if (iVar5 == 4) break;
      iVar4 = xmlMemBlocks();
      uVar6 = gen_int(iVar5,iVar2);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathLastFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathLastFunction",(ulong)(uint)(iVar2 - iVar4));
        local_6c = local_6c + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar5 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  bVar19 = true;
LAB_001469ab:
  if (bVar19) {
    bVar19 = true;
    while (bVar19) {
      iVar5 = xmlMemBlocks();
      bVar19 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlXPathLeading(0);
      xmlXPathFreeNodeSet();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar5 == iVar4) goto LAB_001469ab;
      xmlMemBlocks();
      bVar19 = false;
      printf("Leak of %d blocks found in xmlXPathLeading");
      iVar2 = iVar2 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar19 = false;
    goto LAB_001469ab;
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  bVar19 = true;
LAB_00146a47:
  if (bVar19) {
    bVar19 = true;
    while (bVar19) {
      iVar4 = xmlMemBlocks();
      bVar19 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlXPathLeadingSorted(0);
      xmlXPathFreeNodeSet();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar4 == iVar7) goto LAB_00146a47;
      xmlMemBlocks();
      bVar19 = false;
      printf("Leak of %d blocks found in xmlXPathLeadingSorted");
      iVar5 = iVar5 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar19 = false;
    goto LAB_00146a47;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar4 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar7 = (int)in_RSI;
      iVar9 = (int)pxVar18;
      if (iVar9 == 4) break;
      iVar8 = xmlMemBlocks();
      uVar6 = gen_int(iVar9,iVar7);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathLocalNameFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar8 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathLocalNameFunction",(ulong)(uint)(iVar7 - iVar8));
        iVar4 = iVar4 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar9 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  local_8c = -(iVar4 + test_ret_29 +
              local_78 + local_6c + iVar2 + iVar5 +
              local_80 + local_74 + iVar1 + test_ret_1 + local_70 + local_84 + iVar3);
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathModValues(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathModValues");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathMultValues(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathMultValues");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar3 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathNamespaceURIFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNamespaceURIFunction",
               (ulong)(uint)(iVar1 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
    iVar2 = xmlMemBlocks();
    iVar5 = gen_int(uVar6,(int)in_RSI);
    xmlXPathNewBoolean(iVar5);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar2 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewBoolean",(ulong)(uint)(iVar5 - iVar2));
      iVar1 = iVar1 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  puVar21 = &DAT_0015bd68;
  iVar2 = 0;
  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
    iVar5 = xmlMemBlocks();
    if (uVar6 < 3) {
      uVar10 = *puVar21;
    }
    else {
      uVar10 = 0;
    }
    xmlXPathNewCString(uVar10);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar5 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewCString",(ulong)(uint)(iVar4 - iVar5));
      iVar2 = iVar2 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
    puVar21 = puVar21 + 1;
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
    iVar4 = xmlMemBlocks();
    if (uVar6 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = _xmlXPathNAN;
      if (uVar6 != 2) {
        if (uVar6 == 1) {
          uVar10 = 0xbff199999999999a;
        }
        else {
          uVar10 = 0xbff0000000000000;
        }
      }
    }
    xmlXPathNewFloat(uVar10);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar4 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewFloat",(ulong)(uint)(iVar7 - iVar4));
      iVar5 = iVar5 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  pxVar18 = (xmlNodePtr)0x0;
  while( true ) {
    iVar7 = (int)in_RSI;
    iVar9 = (int)pxVar18;
    if (iVar9 == 3) break;
    iVar8 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(iVar9,iVar7);
    uVar10 = xmlXPathNewNodeSet(in_RSI);
    xmlXPathFreeObject(uVar10);
    call_tests = call_tests + 1;
    des_xmlNodePtr(iVar9,in_RSI,nr);
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar8 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewNodeSet",(ulong)(uint)(iVar7 - iVar8));
      iVar4 = iVar4 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar18;
    }
    pxVar18 = (xmlNodePtr)(ulong)(iVar9 + 1);
  }
  function_tests = function_tests + 1;
  local_8c = local_8c - (iVar2 + iVar5 + iVar3 + iVar1 + iVar4);
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    uVar10 = xmlXPathNewNodeSetList(0);
    xmlXPathFreeObject(uVar10);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathNewNodeSetList");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  local_58 = 0;
  pxVar18 = (xmlNodePtr)0x0;
  while (iVar3 = (int)pxVar18, iVar3 != 5) {
    iVar1 = xmlMemBlocks();
    pxVar13 = gen_const_xmlChar_ptr(iVar3,(int)in_RSI);
    xmlXPathNewString(pxVar13);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewString",(ulong)(uint)(iVar2 - iVar1));
      local_58 = local_58 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar18;
    }
    pxVar18 = (xmlNodePtr)(ulong)(iVar3 + 1);
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_84 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar1 = (int)pxVar18;
      if (iVar1 == 3) break;
      iVar2 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar1,iVar3);
      pxVar11 = (xmlNodePtr)xmlXPathNextAncestor(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar1,in_RSI,nr_00);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextAncestor",(ulong)(uint)(iVar3 - iVar2));
        local_84 = local_84 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar1 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  test_ret_1 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar1 = (int)pxVar18;
      if (iVar1 == 3) break;
      iVar2 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar1,iVar3);
      pxVar11 = (xmlNodePtr)xmlXPathNextAncestorOrSelf(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar1,in_RSI,nr_01);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextAncestorOrSelf",(ulong)(uint)(iVar3 - iVar2))
        ;
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar1 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_80 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar1 = (int)pxVar18;
      if (iVar1 == 3) break;
      iVar2 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar1,iVar3);
      pxVar11 = (xmlNodePtr)xmlXPathNextAttribute(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar1,in_RSI,nr_02);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextAttribute",(ulong)(uint)(iVar3 - iVar2));
        local_80 = local_80 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar1 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_78 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar1 = (int)pxVar18;
      if (iVar1 == 3) break;
      iVar2 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar1,iVar3);
      pxVar11 = (xmlNodePtr)xmlXPathNextChild(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar1,in_RSI,nr_03);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextChild",(ulong)(uint)(iVar3 - iVar2));
        local_78 = local_78 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar1 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_6c = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar1 = (int)pxVar18;
      if (iVar1 == 3) break;
      iVar2 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar1,iVar3);
      pxVar11 = (xmlNodePtr)xmlXPathNextDescendant(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar1,in_RSI,nr_04);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextDescendant",(ulong)(uint)(iVar3 - iVar2));
        local_6c = local_6c + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar1 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_70 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar1 = (int)pxVar18;
      if (iVar1 == 3) break;
      iVar2 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar1,iVar3);
      pxVar11 = (xmlNodePtr)xmlXPathNextDescendantOrSelf(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar1,in_RSI,nr_05);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextDescendantOrSelf",
               (ulong)(uint)(iVar3 - iVar2));
        local_70 = local_70 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar1 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_74 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar1 = (int)pxVar18;
      if (iVar1 == 3) break;
      iVar2 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar1,iVar3);
      pxVar11 = (xmlNodePtr)xmlXPathNextFollowing(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar1,in_RSI,nr_06);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextFollowing",(ulong)(uint)(iVar3 - iVar2));
        local_74 = local_74 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar1 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar3 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      pxVar11 = (xmlNodePtr)xmlXPathNextFollowingSibling(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_07);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextFollowingSibling",
               (ulong)(uint)(iVar1 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_5c = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      pxVar11 = (xmlNodePtr)xmlXPathNextNamespace(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_08);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextNamespace",(ulong)(uint)(iVar1 - iVar5));
        local_5c = local_5c + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_38 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      pxVar11 = (xmlNodePtr)xmlXPathNextParent(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_09);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextParent",(ulong)(uint)(iVar1 - iVar5));
        local_38 = local_38 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_3c = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      pxVar11 = (xmlNodePtr)xmlXPathNextPreceding(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_10);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextPreceding",(ulong)(uint)(iVar1 - iVar5));
        local_3c = local_3c + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_40 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      pxVar11 = (xmlNodePtr)xmlXPathNextPrecedingSibling(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_11);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextPrecedingSibling",
               (ulong)(uint)(iVar1 - iVar5));
        local_40 = local_40 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_44 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      pxVar11 = (xmlNodePtr)xmlXPathNextSelf(0,in_RSI);
      desret_xmlNodePtr(pxVar11);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_12);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextSelf",(ulong)(uint)(iVar1 - iVar5));
        local_44 = local_44 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_48 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      uVar10 = xmlXPathNodeLeading(0,in_RSI);
      xmlXPathFreeNodeSet(uVar10);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_13);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeLeading",(ulong)(uint)(iVar1 - iVar5));
        local_48 = local_48 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_4c = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      uVar10 = xmlXPathNodeLeadingSorted(0,in_RSI);
      xmlXPathFreeNodeSet(uVar10);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_14);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeLeadingSorted",(ulong)(uint)(iVar1 - iVar5));
        local_4c = local_4c + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_50 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      xmlXPathNodeSetAdd(0,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_15);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeSetAdd",(ulong)(uint)(iVar1 - iVar5));
        local_50 = local_50 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  pxVar18 = (xmlNodePtr)0x1;
  test_ret_29 = 0;
  while (pxVar18 != (xmlNodePtr)0x0) {
    uVar17 = 0;
    while( true ) {
      pxVar18 = (xmlNodePtr)0x0;
      iVar1 = (int)uVar17;
      if (iVar1 == 3) break;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar5 = (int)pxVar18;
        if (iVar5 == 2) break;
        iVar4 = xmlMemBlocks();
        in_RSI = gen_xmlNodePtr(iVar1,iVar2);
        pxVar14 = gen_xmlNsPtr(iVar5,iVar2);
        xmlXPathNodeSetAddNs(0,in_RSI,pxVar14);
        call_tests = call_tests + 1;
        des_xmlNodePtr(iVar1,in_RSI,nr_16);
        if (iVar5 == 0) {
          free_api_doc();
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar4 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathNodeSetAddNs",(ulong)(uint)(iVar2 - iVar4));
          test_ret_29 = test_ret_29 + 1;
          printf(" %d",0);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar18;
        }
        pxVar18 = (xmlNodePtr)(ulong)(iVar5 + 1);
      }
      uVar17 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_54 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      xmlXPathNodeSetAddUnique(0,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_17);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeSetAddUnique",(ulong)(uint)(iVar1 - iVar5));
        local_54 = local_54 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar1 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar5 = (int)pxVar18;
      if (iVar5 == 3) break;
      iVar4 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar5,iVar2);
      xmlXPathNodeSetContains(0,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar5,in_RSI,nr_18);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeSetContains",(ulong)(uint)(iVar2 - iVar4));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar5 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar2 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar4 = (int)pxVar18;
      if (iVar4 == 3) break;
      iVar7 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar4,iVar5);
      xmlXPathNodeSetDel(0,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar4,in_RSI,nr_19);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar7 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeSetDel",(ulong)(uint)(iVar5 - iVar7));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar4 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  bVar19 = true;
LAB_00147fc2:
  if (bVar19) {
    bVar19 = true;
    while (bVar19) {
      iVar4 = xmlMemBlocks();
      bVar19 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlXPathNodeSetMerge(0);
      xmlXPathFreeNodeSet();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar4 == iVar7) goto LAB_00147fc2;
      xmlMemBlocks();
      bVar19 = false;
      printf("Leak of %d blocks found in xmlXPathNodeSetMerge");
      iVar5 = iVar5 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar19 = false;
    goto LAB_00147fc2;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar4 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar7 = (int)in_RSI;
      iVar9 = (int)pxVar18;
      if (iVar9 == 4) break;
      iVar8 = xmlMemBlocks();
      uVar6 = gen_int(iVar9,iVar7);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathNodeSetRemove();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar8 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeSetRemove",(ulong)(uint)(iVar7 - iVar8));
        iVar4 = iVar4 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar9 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  local_8c = local_8c -
             (local_50 + test_ret_29 + local_54 + iVar1 + iVar2 + iVar5 +
              local_3c + local_40 + local_44 + local_48 + local_4c +
              local_74 + iVar3 + local_5c + local_38 +
              local_78 + local_6c + local_70 + test_ret_1 + local_80 + local_58 + local_84 + iVar4);
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathNodeSetSort(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathNodeSetSort");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar3 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 3) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar2,iVar1);
      uVar10 = xmlXPathNodeTrailing(0,in_RSI);
      xmlXPathFreeNodeSet(uVar10);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,in_RSI,nr_20);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeTrailing",(ulong)(uint)(iVar1 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar1 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar5 = (int)pxVar18;
      if (iVar5 == 3) break;
      iVar4 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar5,iVar2);
      uVar10 = xmlXPathNodeTrailingSorted(0,in_RSI);
      xmlXPathFreeNodeSet(uVar10);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar5,in_RSI,nr_21);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeTrailingSorted",(ulong)(uint)(iVar2 - iVar4))
        ;
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar5 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar2 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar4 = (int)pxVar18;
      if (iVar4 == 4) break;
      iVar7 = xmlMemBlocks();
      uVar6 = gen_int(iVar4,iVar5);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathNormalizeFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar7 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNormalizeFunction",(ulong)(uint)(iVar5 - iVar7));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar4 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  local_8c = local_8c - (iVar3 + iVar1 + iVar2);
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathNotEqualValues(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathNotEqualValues");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar3 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathNotFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNotFunction",(ulong)(uint)(iVar1 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar1 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar5 = (int)pxVar18;
      if (iVar5 == 5) break;
      iVar4 = xmlMemBlocks();
      in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar5,iVar2);
      xmlXPathNsLookup();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNsLookup",(ulong)(uint)(iVar2 - iVar4));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar5 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar2 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar4 = (int)pxVar18;
      if (iVar4 == 4) break;
      iVar7 = xmlMemBlocks();
      uVar6 = gen_int(iVar4,iVar5);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathNumberFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar7 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNumberFunction",(ulong)(uint)(iVar5 - iVar7));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar4 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  local_8c = local_8c - (iVar3 + iVar1 + iVar2);
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    lVar15 = xmlXPathParseNCName(0);
    if (lVar15 != 0) {
      (*_xmlFree)(lVar15);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathParseNCName");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    lVar15 = xmlXPathParseName(0);
    if (lVar15 != 0) {
      (*_xmlFree)(lVar15);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathParseName");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathPopBoolean(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathPopBoolean");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathPopExternal(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathPopExternal");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    uVar10 = xmlXPathPopNodeSet(0);
    xmlXPathFreeNodeSet(uVar10);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathPopNodeSet");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathPopNumber(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathPopNumber");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    lVar15 = xmlXPathPopString(0);
    if (lVar15 != 0) {
      (*_xmlFree)(lVar15);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathPopString");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar3 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathPositionFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathPositionFunction",(ulong)(uint)(iVar1 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  local_8c = local_8c - iVar3;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathRegisterAllFunctions(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathRegisterAllFunctions");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  pxVar18 = (xmlNodePtr)0x1;
  test_ret_1 = 0;
  while (pxVar18 != (xmlNodePtr)0x0) {
    uVar17 = 0;
    while( true ) {
      pxVar18 = (xmlNodePtr)0x0;
      iVar3 = (int)uVar17;
      if (iVar3 == 5) break;
      while( true ) {
        iVar1 = (int)in_RSI;
        iVar2 = (int)pxVar18;
        if (iVar2 == 5) break;
        iVar5 = xmlMemBlocks();
        in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar3,iVar1);
        pxVar13 = gen_const_xmlChar_ptr(iVar2,iVar1);
        xmlXPathRegisterNs(0,in_RSI,pxVar13);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar1 = xmlMemBlocks();
        if (iVar5 != iVar1) {
          iVar1 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathRegisterNs",(ulong)(uint)(iVar1 - iVar5));
          test_ret_1 = test_ret_1 + 1;
          printf(" %d",0);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar18;
        }
        pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
      }
      uVar17 = (ulong)(iVar3 + 1);
    }
  }
  function_tests = function_tests + 1;
  pxVar18 = (xmlNodePtr)0x1;
  local_80 = 0;
  while (pxVar18 != (xmlNodePtr)0x0) {
    uVar17 = 0;
    while( true ) {
      pxVar18 = (xmlNodePtr)0x0;
      iVar3 = (int)uVar17;
      if (iVar3 == 5) break;
      while( true ) {
        iVar1 = (int)in_RSI;
        iVar2 = (int)pxVar18;
        if (iVar2 == 5) break;
        iVar5 = xmlMemBlocks();
        in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar3,iVar1);
        pxVar16 = gen_xmlXPathObjectPtr(iVar2,iVar1);
        xmlXPathRegisterVariable(0,in_RSI,pxVar16);
        call_tests = call_tests + 1;
        if (pxVar16 != (xmlXPathObjectPtr)0x0) {
          xmlXPathFreeObject();
        }
        xmlResetLastError();
        iVar1 = xmlMemBlocks();
        if (iVar5 != iVar1) {
          iVar1 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathRegisterVariable",(ulong)(uint)(iVar1 - iVar5))
          ;
          local_80 = local_80 + 1;
          printf(" %d",0);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar18;
        }
        pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
      }
      uVar17 = (ulong)(iVar3 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar6 = 1;
  local_84 = 0;
  while (uVar6 != 0) {
    uVar17 = 0;
    while( true ) {
      uVar6 = 0;
      iVar3 = (int)uVar17;
      if (iVar3 == 5) break;
      for (; uVar6 != 5; uVar6 = uVar6 + 1) {
        for (no = 0; iVar1 = (int)in_RSI, no != 5; no = no + 1) {
          iVar2 = xmlMemBlocks();
          in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar3,iVar1);
          pxVar13 = gen_const_xmlChar_ptr(uVar6,iVar1);
          pxVar16 = gen_xmlXPathObjectPtr(no,iVar1);
          xmlXPathRegisterVariableNS(0,in_RSI,pxVar13,pxVar16);
          call_tests = call_tests + 1;
          if (pxVar16 != (xmlXPathObjectPtr)0x0) {
            xmlXPathFreeObject();
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar2 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlXPathRegisterVariableNS",
                   (ulong)(uint)(iVar1 - iVar2));
            local_84 = local_84 + 1;
            printf(" %d",0);
            printf(" %d",uVar17);
            printf(" %d",(ulong)uVar6);
            in_RSI = (xmlNodePtr)(ulong)no;
            printf(" %d");
            putchar(10);
          }
        }
      }
      uVar17 = (ulong)(iVar3 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_8c = local_8c - (test_ret_1 + local_80 + local_84);
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathRegisteredFuncsCleanup(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathRegisteredFuncsCleanup");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathRegisteredNsCleanup(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathRegisteredNsCleanup");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathRegisteredVariablesCleanup(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathRegisteredVariablesCleanup");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathRoot(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathRoot");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar3 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathRoundFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathRoundFunction",(ulong)(uint)(iVar1 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar1 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar5 = (int)pxVar18;
      if (iVar5 == 4) break;
      iVar4 = xmlMemBlocks();
      uVar6 = gen_int(iVar5,iVar2);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathStartsWithFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathStartsWithFunction",(ulong)(uint)(iVar2 - iVar4))
        ;
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar5 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  test_ret_29 = 0;
  pxVar18 = (xmlNodePtr)0x0;
  while (iVar2 = (int)pxVar18, iVar2 != 5) {
    iVar5 = xmlMemBlocks();
    gen_const_xmlChar_ptr(iVar2,(int)in_RSI);
    xmlXPathStringEvalNumber();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar5 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathStringEvalNumber",(ulong)(uint)(iVar4 - iVar5));
      test_ret_29 = test_ret_29 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar18;
    }
    pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar2 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar4 = (int)pxVar18;
      if (iVar4 == 4) break;
      iVar7 = xmlMemBlocks();
      uVar6 = gen_int(iVar4,iVar5);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathStringFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar7 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathStringFunction",(ulong)(uint)(iVar5 - iVar7));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar4 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar5 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar4 = (int)in_RSI;
      iVar7 = (int)pxVar18;
      if (iVar7 == 4) break;
      iVar9 = xmlMemBlocks();
      uVar6 = gen_int(iVar7,iVar4);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathStringLengthFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar9 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathStringLengthFunction",
               (ulong)(uint)(iVar4 - iVar9));
        iVar5 = iVar5 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar7 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  local_8c = local_8c - (test_ret_29 + iVar2 + iVar3 + iVar1 + iVar5);
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathSubValues(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathSubValues");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar3 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathSubstringAfterFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathSubstringAfterFunction",
               (ulong)(uint)(iVar1 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  test_ret_29 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathSubstringBeforeFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathSubstringBeforeFunction",
               (ulong)(uint)(iVar1 - iVar5));
        test_ret_29 = test_ret_29 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  local_84 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathSubstringFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathSubstringFunction",(ulong)(uint)(iVar1 - iVar5));
        local_84 = local_84 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  test_ret_1 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar18;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      uVar6 = gen_int(iVar2,iVar1);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathSumFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar5 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathSumFunction",(ulong)(uint)(iVar1 - iVar5));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  local_80 = 0;
  bVar19 = true;
LAB_001494ff:
  if (bVar19) {
    bVar19 = true;
    while (bVar19) {
      iVar1 = xmlMemBlocks();
      bVar19 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlXPathTrailing(0);
      xmlXPathFreeNodeSet();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 == iVar2) goto LAB_001494ff;
      xmlMemBlocks();
      bVar19 = false;
      printf("Leak of %d blocks found in xmlXPathTrailing");
      local_80 = local_80 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar19 = false;
    goto LAB_001494ff;
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  bVar19 = true;
LAB_001495a4:
  if (bVar19) {
    bVar19 = true;
    while (bVar19) {
      iVar2 = xmlMemBlocks();
      bVar19 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlXPathTrailingSorted(0);
      xmlXPathFreeNodeSet();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar2 == iVar5) goto LAB_001495a4;
      xmlMemBlocks();
      bVar19 = false;
      printf("Leak of %d blocks found in xmlXPathTrailingSorted");
      iVar1 = iVar1 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar19 = false;
    goto LAB_001495a4;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar2 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar4 = (int)pxVar18;
      if (iVar4 == 4) break;
      iVar7 = xmlMemBlocks();
      uVar6 = gen_int(iVar4,iVar5);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathTranslateFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar7 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathTranslateFunction",(ulong)(uint)(iVar5 - iVar7));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar4 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  iVar5 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar4 = (int)in_RSI;
      iVar7 = (int)pxVar18;
      if (iVar7 == 4) break;
      iVar9 = xmlMemBlocks();
      uVar6 = gen_int(iVar7,iVar4);
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      xmlXPathTrueFunction();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar9 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathTrueFunction",(ulong)(uint)(iVar4 - iVar9));
        iVar5 = iVar5 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar7 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  local_8c = local_8c -
             (local_80 + iVar1 + iVar2 + local_84 + test_ret_1 + iVar3 + test_ret_29 + iVar5);
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    xmlXPathValueFlipSign(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathValueFlipSign");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  bVar19 = true;
  test_ret_29 = 0;
  while (bVar19) {
    pxVar18 = (xmlNodePtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar1 = (int)pxVar18;
      if (iVar1 == 5) break;
      iVar2 = xmlMemBlocks();
      in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar1,iVar3);
      xmlXPathVariableLookup(0);
      xmlXPathFreeObject();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathVariableLookup",(ulong)(uint)(iVar3 - iVar2));
        test_ret_29 = test_ret_29 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar18;
      }
      pxVar18 = (xmlNodePtr)(ulong)(iVar1 + 1);
    }
    bVar19 = false;
  }
  function_tests = function_tests + 1;
  pxVar18 = (xmlNodePtr)0x1;
  iVar3 = 0;
  while (pxVar18 != (xmlNodePtr)0x0) {
    uVar17 = 0;
    while( true ) {
      pxVar18 = (xmlNodePtr)0x0;
      iVar1 = (int)uVar17;
      if (iVar1 == 5) break;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar5 = (int)pxVar18;
        if (iVar5 == 5) break;
        iVar4 = xmlMemBlocks();
        in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar1,iVar2);
        pxVar13 = gen_const_xmlChar_ptr(iVar5,iVar2);
        xmlXPathVariableLookupNS(0,in_RSI,pxVar13);
        xmlXPathFreeObject();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar4 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathVariableLookupNS",(ulong)(uint)(iVar2 - iVar4))
          ;
          iVar3 = iVar3 + 1;
          printf(" %d",0);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar18;
        }
        pxVar18 = (xmlNodePtr)(ulong)(iVar5 + 1);
      }
      uVar17 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_8c = local_8c - (test_ret_29 + iVar3);
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    uVar10 = xmlXPathWrapCString(0);
    xmlXPathFreeObject(uVar10);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathWrapCString");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  for (uVar6 = 0; uVar6 != 2; uVar6 = uVar6 + 1) {
    iVar1 = xmlMemBlocks();
    xmlXPathWrapExternal(0);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathWrapExternal",(ulong)(uint)(iVar2 - iVar1));
      iVar3 = iVar3 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar6;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_8c = local_8c - iVar3;
  bVar19 = true;
  while (bVar19) {
    iVar3 = xmlMemBlocks();
    uVar10 = xmlXPathWrapNodeSet(0);
    xmlXPathFreeObject(uVar10);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar19 = false;
    printf("Leak of %d blocks found in xmlXPathWrapNodeSet");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_8c = local_8c + -1;
  }
  function_tests = function_tests + 1;
  uVar17 = 1;
  test_ret_29 = 0;
  while (uVar17 != 0) {
    for (uVar6 = 0; uVar17 = 0, uVar6 != 8; uVar6 = uVar6 + 1) {
      while (iVar3 = (int)uVar17, iVar3 != 4) {
        pxVar18 = (xmlNodePtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar18;
          if (iVar2 == 4) break;
          iVar5 = xmlMemBlocks();
          in_RSI = (xmlNodePtr)gen_filepath(uVar6,iVar1);
          iVar4 = gen_int(iVar3,iVar1);
          iVar1 = gen_int(iVar2,iVar1);
          xmlXPatherror(0,in_RSI,iVar4,iVar1);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar5 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlXPatherror",(ulong)(uint)(iVar1 - iVar5));
            test_ret_29 = test_ret_29 + 1;
            printf(" %d",0);
            printf(" %d",(ulong)uVar6);
            printf(" %d",uVar17);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar18;
          }
          pxVar18 = (xmlNodePtr)(ulong)(iVar2 + 1);
        }
        uVar17 = (ulong)(iVar3 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  uVar6 = test_ret_29 - local_8c;
  if (uVar6 != 0) {
    printf("Module xpathInternals: %d errors\n",(ulong)uVar6);
  }
  return uVar6;
}

Assistant:

static int
test_xpathInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpathInternals : 106 of 117 functions ...\n");
    test_ret += test_valuePop();
    test_ret += test_valuePush();
    test_ret += test_xmlXPathAddValues();
    test_ret += test_xmlXPathBooleanFunction();
    test_ret += test_xmlXPathCeilingFunction();
    test_ret += test_xmlXPathCompareValues();
    test_ret += test_xmlXPathConcatFunction();
    test_ret += test_xmlXPathContainsFunction();
    test_ret += test_xmlXPathCountFunction();
    test_ret += test_xmlXPathDebugDumpCompExpr();
    test_ret += test_xmlXPathDebugDumpObject();
    test_ret += test_xmlXPathDifference();
    test_ret += test_xmlXPathDistinct();
    test_ret += test_xmlXPathDistinctSorted();
    test_ret += test_xmlXPathDivValues();
    test_ret += test_xmlXPathEqualValues();
    test_ret += test_xmlXPathErr();
    test_ret += test_xmlXPathEvalExpr();
    test_ret += test_xmlXPathEvaluatePredicateResult();
    test_ret += test_xmlXPathFalseFunction();
    test_ret += test_xmlXPathFloorFunction();
    test_ret += test_xmlXPathFunctionLookup();
    test_ret += test_xmlXPathFunctionLookupNS();
    test_ret += test_xmlXPathHasSameNodes();
    test_ret += test_xmlXPathIdFunction();
    test_ret += test_xmlXPathIntersection();
    test_ret += test_xmlXPathIsNodeType();
    test_ret += test_xmlXPathLangFunction();
    test_ret += test_xmlXPathLastFunction();
    test_ret += test_xmlXPathLeading();
    test_ret += test_xmlXPathLeadingSorted();
    test_ret += test_xmlXPathLocalNameFunction();
    test_ret += test_xmlXPathModValues();
    test_ret += test_xmlXPathMultValues();
    test_ret += test_xmlXPathNamespaceURIFunction();
    test_ret += test_xmlXPathNewBoolean();
    test_ret += test_xmlXPathNewCString();
    test_ret += test_xmlXPathNewFloat();
    test_ret += test_xmlXPathNewNodeSet();
    test_ret += test_xmlXPathNewNodeSetList();
    test_ret += test_xmlXPathNewParserContext();
    test_ret += test_xmlXPathNewString();
    test_ret += test_xmlXPathNextAncestor();
    test_ret += test_xmlXPathNextAncestorOrSelf();
    test_ret += test_xmlXPathNextAttribute();
    test_ret += test_xmlXPathNextChild();
    test_ret += test_xmlXPathNextDescendant();
    test_ret += test_xmlXPathNextDescendantOrSelf();
    test_ret += test_xmlXPathNextFollowing();
    test_ret += test_xmlXPathNextFollowingSibling();
    test_ret += test_xmlXPathNextNamespace();
    test_ret += test_xmlXPathNextParent();
    test_ret += test_xmlXPathNextPreceding();
    test_ret += test_xmlXPathNextPrecedingSibling();
    test_ret += test_xmlXPathNextSelf();
    test_ret += test_xmlXPathNodeLeading();
    test_ret += test_xmlXPathNodeLeadingSorted();
    test_ret += test_xmlXPathNodeSetAdd();
    test_ret += test_xmlXPathNodeSetAddNs();
    test_ret += test_xmlXPathNodeSetAddUnique();
    test_ret += test_xmlXPathNodeSetContains();
    test_ret += test_xmlXPathNodeSetDel();
    test_ret += test_xmlXPathNodeSetMerge();
    test_ret += test_xmlXPathNodeSetRemove();
    test_ret += test_xmlXPathNodeSetSort();
    test_ret += test_xmlXPathNodeTrailing();
    test_ret += test_xmlXPathNodeTrailingSorted();
    test_ret += test_xmlXPathNormalizeFunction();
    test_ret += test_xmlXPathNotEqualValues();
    test_ret += test_xmlXPathNotFunction();
    test_ret += test_xmlXPathNsLookup();
    test_ret += test_xmlXPathNumberFunction();
    test_ret += test_xmlXPathParseNCName();
    test_ret += test_xmlXPathParseName();
    test_ret += test_xmlXPathPopBoolean();
    test_ret += test_xmlXPathPopExternal();
    test_ret += test_xmlXPathPopNodeSet();
    test_ret += test_xmlXPathPopNumber();
    test_ret += test_xmlXPathPopString();
    test_ret += test_xmlXPathPositionFunction();
    test_ret += test_xmlXPathRegisterAllFunctions();
    test_ret += test_xmlXPathRegisterFunc();
    test_ret += test_xmlXPathRegisterFuncLookup();
    test_ret += test_xmlXPathRegisterFuncNS();
    test_ret += test_xmlXPathRegisterNs();
    test_ret += test_xmlXPathRegisterVariable();
    test_ret += test_xmlXPathRegisterVariableLookup();
    test_ret += test_xmlXPathRegisterVariableNS();
    test_ret += test_xmlXPathRegisteredFuncsCleanup();
    test_ret += test_xmlXPathRegisteredNsCleanup();
    test_ret += test_xmlXPathRegisteredVariablesCleanup();
    test_ret += test_xmlXPathRoot();
    test_ret += test_xmlXPathRoundFunction();
    test_ret += test_xmlXPathStartsWithFunction();
    test_ret += test_xmlXPathStringEvalNumber();
    test_ret += test_xmlXPathStringFunction();
    test_ret += test_xmlXPathStringLengthFunction();
    test_ret += test_xmlXPathSubValues();
    test_ret += test_xmlXPathSubstringAfterFunction();
    test_ret += test_xmlXPathSubstringBeforeFunction();
    test_ret += test_xmlXPathSubstringFunction();
    test_ret += test_xmlXPathSumFunction();
    test_ret += test_xmlXPathTrailing();
    test_ret += test_xmlXPathTrailingSorted();
    test_ret += test_xmlXPathTranslateFunction();
    test_ret += test_xmlXPathTrueFunction();
    test_ret += test_xmlXPathValueFlipSign();
    test_ret += test_xmlXPathVariableLookup();
    test_ret += test_xmlXPathVariableLookupNS();
    test_ret += test_xmlXPathWrapCString();
    test_ret += test_xmlXPathWrapExternal();
    test_ret += test_xmlXPathWrapNodeSet();
    test_ret += test_xmlXPatherror();

    if (test_ret != 0)
	printf("Module xpathInternals: %d errors\n", test_ret);
    return(test_ret);
}